

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O1

TestNode * __thiscall xe::TestGroup::findChildNode(TestGroup *this,char *path)

{
  ulong uVar1;
  pointer ppTVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  Error *this_00;
  pointer ppTVar6;
  ulong uVar7;
  int compLen;
  int iVar8;
  ulong uVar9;
  
  do {
    uVar9 = 0;
    while( true ) {
      iVar8 = (int)uVar9;
      if ((path[iVar8] == '\0') || (path[iVar8] == '.')) break;
      uVar9 = (ulong)(iVar8 + 1);
    }
    if (iVar8 < 1) {
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,(char *)0x0,"compLen > 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                   ,0xce);
      __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppTVar6 = (this->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (this->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar6 != ppTVar2) {
      do {
        this = (TestGroup *)*ppTVar6;
        pcVar3 = (this->super_TestNode).m_name._M_dataplus._M_p;
        if (*pcVar3 == *path) {
          uVar7 = 0;
          do {
            if (uVar9 - 1 == uVar7) goto LAB_00117951;
            lVar4 = uVar7 + 1;
            uVar1 = uVar7 + 1;
            lVar5 = uVar7 + 1;
            uVar7 = uVar1;
          } while (pcVar3[lVar4] == path[lVar5]);
          if (uVar9 <= uVar1) {
LAB_00117951:
            if (pcVar3[iVar8] == '\0') goto LAB_00117963;
          }
        }
        ppTVar6 = ppTVar6 + 1;
      } while (ppTVar6 != ppTVar2);
    }
    this = (TestGroup *)0x0;
LAB_00117963:
    if (this == (TestGroup *)0x0) {
      return (TestNode *)0x0;
    }
    if (path[iVar8] == '\0') {
      return &this->super_TestNode;
    }
    if ((this->super_TestNode).m_nodeType != TESTNODETYPE_GROUP) {
      return (TestNode *)0x0;
    }
    path = path + (long)iVar8 + 1;
  } while( true );
}

Assistant:

const TestNode* TestGroup::findChildNode (const char* path) const
{
	int compLen = getFirstComponentLength(path);
	XE_CHECK(compLen > 0);

	// Try to find matching children.
	const TestNode* matchingNode = DE_NULL;
	for (vector<TestNode*>::const_iterator iter = m_children.begin(); iter != m_children.end(); iter++)
	{
		if (compareNameToPathComponent((*iter)->getName(), path, compLen))
		{
			matchingNode = *iter;
			break;
		}
	}

	if (matchingNode)
	{
		if (path[compLen] == 0)
			return matchingNode; // Last element in path, return matching node.
		else if (matchingNode->getNodeType() == TESTNODETYPE_GROUP)
			return static_cast<const TestGroup*>(matchingNode)->findChildNode(path + compLen + 1);
		else
			return DE_NULL;
	}
	else
		return DE_NULL;
}